

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_blend2.cpp
# Opt level: O0

int str_to_blend_mode(string *str)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
  if (bVar1) {
    local_4 = 0;
  }
  else {
    bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
    if (bVar1) {
      local_4 = 1;
    }
    else {
      bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
      if (bVar1) {
        local_4 = 4;
      }
      else {
        bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
        if (bVar1) {
          local_4 = 5;
        }
        else {
          bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
          if (bVar1) {
            local_4 = 6;
          }
          else {
            bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
            if (bVar1) {
              local_4 = 7;
            }
            else {
              bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
              if (bVar1) {
                local_4 = 2;
              }
              else {
                bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
                if (bVar1) {
                  local_4 = 3;
                }
                else {
                  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
                  if (bVar1) {
                    local_4 = 0;
                  }
                  else {
                    bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
                    if (bVar1) {
                      local_4 = 1;
                    }
                    else {
                      bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
                      if (bVar1) {
                        local_4 = 2;
                      }
                      else {
                        bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
                        if (bVar1) {
                          local_4 = 8;
                        }
                        else {
                          bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
                          if (bVar1) {
                            local_4 = 9;
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int str_to_blend_mode(const std::string & str)
{
   if (str == "ZERO")
      return ALLEGRO_ZERO;
   if (str == "ONE")
      return ALLEGRO_ONE;
   if (str == "SRC_COLOR")
      return ALLEGRO_SRC_COLOR;
   if (str == "DEST_COLOR")
      return ALLEGRO_DEST_COLOR;
   if (str == "INV_SRC_COLOR")
      return ALLEGRO_INVERSE_SRC_COLOR;
   if (str == "INV_DEST_COLOR")
      return ALLEGRO_INVERSE_DEST_COLOR;
   if (str == "ALPHA")
      return ALLEGRO_ALPHA;
   if (str == "INVERSE")
      return ALLEGRO_INVERSE_ALPHA;
   if (str == "ADD")
      return ALLEGRO_ADD;
   if (str == "SRC_MINUS_DEST")
      return ALLEGRO_SRC_MINUS_DEST;
   if (str == "DEST_MINUS_SRC")
      return ALLEGRO_DEST_MINUS_SRC;
   if (str == "CONST_COLOR")
      return ALLEGRO_CONST_COLOR;
   if (str == "INV_CONST_COLOR")
      return ALLEGRO_INVERSE_CONST_COLOR;

   ALLEGRO_ASSERT(false);
   return ALLEGRO_ONE;
}